

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::anon_unknown_0::IsViewValidUTF8WithLeftover
          (anon_unknown_0 *this,string_view fragment,LeftoverBuffer *leftover)

{
  string_view from;
  char *failure_msg;
  LogMessage *pLVar1;
  ulong __n;
  size_type sVar2;
  size_t sVar3;
  size_t sVar4;
  uint *puVar5;
  uint *extraout_RDX;
  string_view sVar6;
  basic_string_view<char,_std::char_traits<char>_> from_00;
  string_view str;
  string_view str_00;
  string_view str_01;
  size_t valid;
  size_t leftover_valid;
  utf8_range *local_88;
  size_t fill_size;
  Voidify local_49;
  unsigned_long local_48;
  unsigned_long local_40;
  Nullable<const_char_*> local_38;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  size_t leftover_size;
  LeftoverBuffer *leftover_local;
  string_view fragment_local;
  
  puVar5 = (uint *)fragment._M_str;
  fragment_local._M_len = fragment._M_len;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)(ulong)*puVar5;
  leftover_size = (size_t)puVar5;
  leftover_local = (LeftoverBuffer *)this;
  if (absl_log_internal_check_op_result != (Nullable<const_char_*>)0x0) {
    local_40 = absl::lts_20250127::log_internal::GetReferenceableValue
                         ((unsigned_long)absl_log_internal_check_op_result);
    local_48 = absl::lts_20250127::log_internal::GetReferenceableValue(4);
    local_38 = absl::lts_20250127::log_internal::Check_LTImpl<unsigned_long,unsigned_long>
                         (&local_40,&local_48,"leftover_size < kUtfMax");
    if (local_38 != (Nullable<const_char_*>)0x0) {
      failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_38);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&fill_size,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
                 ,0x112,failure_msg);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                         ((LogMessage *)&fill_size);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar1);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&fill_size);
    }
    __n = 4 - (long)absl_log_internal_check_op_result;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&leftover_local);
    sVar4 = leftover_size;
    if (sVar2 < __n) {
      sVar6._M_str = (char *)fragment_local._M_len;
      sVar6._M_len = (size_t)leftover_local;
      LeftoverBuffer::append((LeftoverBuffer *)leftover_size,sVar6);
      sVar4 = leftover_size;
      sVar6 = LeftoverBuffer::view((LeftoverBuffer *)leftover_size);
      str._M_str = sVar6._M_str;
      local_88 = (utf8_range *)sVar6._M_len;
      str._M_len = (size_t)str._M_str;
      sVar3 = utf8_range::SpanStructurallyValid(local_88,str);
      LeftoverBuffer::remove_prefix((LeftoverBuffer *)sVar4,(uint32_t)sVar3);
      return true;
    }
    from_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&leftover_local,0,__n);
    LeftoverBuffer::append((LeftoverBuffer *)sVar4,from_00);
    sVar6 = LeftoverBuffer::view((LeftoverBuffer *)leftover_size);
    str_00._M_str = sVar6._M_str;
    valid = sVar6._M_len;
    str_00._M_len = (size_t)str_00._M_str;
    sVar4 = utf8_range::SpanStructurallyValid((utf8_range *)valid,str_00);
    if (sVar4 == 0) {
      return false;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)&leftover_local,
               sVar4 - (long)absl_log_internal_check_op_result);
    puVar5 = extraout_RDX;
  }
  str_01._M_str = (char *)puVar5;
  str_01._M_len = fragment_local._M_len;
  sVar4 = utf8_range::SpanStructurallyValid((utf8_range *)leftover_local,str_01);
  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
            ((basic_string_view<char,_std::char_traits<char>_> *)&leftover_local,sVar4);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&leftover_local);
  if (sVar2 < 4) {
    from._M_str = (char *)fragment_local._M_len;
    from._M_len = (size_t)leftover_local;
    LeftoverBuffer::assign((LeftoverBuffer *)leftover_size,from);
  }
  return sVar2 < 4;
}

Assistant:

bool IsViewValidUTF8WithLeftover(absl::string_view fragment,
                                 LeftoverBuffer& leftover) {
  if (size_t leftover_size = leftover.size; leftover_size > 0) {
    ABSL_DCHECK_LT(leftover_size, kUtfMax);

    // Copy into the leftover buffer until it has kUtfMax bytes, and match code
    // points within that buffer, removing them from the prefix of the next
    // chunk.
    const size_t fill_size = kUtfMax - leftover_size;
    if (fragment.size() < fill_size) {
      // If the full fragment fits in the buffer, match and consume if possible.
      leftover.append(fragment);
      // Opportunistically validate but it's okay otherwise as we may be
      // building up to a valid UTF8.
      leftover.remove_prefix(
          utf8_range::SpanStructurallyValid(leftover.view()));
      return true;
    }

    // Otherwise, fill the buffer from the prefix of the fragment, match, and
    // remove the bytes in the *match* (not the unmatched part of the buffer)
    // that originally came from the current fragment.
    //
    // Note that fragment is big enough to fill leftover to the max UTF8 value.
    // It has to have a valid UTF8.
    leftover.append(fragment.substr(0, fill_size));
    const size_t leftover_valid =
        utf8_range::SpanStructurallyValid(leftover.view());
    if (leftover_valid == 0) {
      return false;
    }
    fragment.remove_prefix(leftover_valid - leftover_size);
  }

  const size_t valid = utf8_range::SpanStructurallyValid(fragment);
  fragment.remove_prefix(valid);
  // If the last Unicode char crosses to next fragment, length must be smaller
  // than kUtfMax.
  if (kUtfMax <= fragment.size()) {
    return false;
  }

  leftover.assign(fragment);

  // So far so good. Continue to the next fragment.
  return true;
}